

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockets_kernel_2.h
# Opt level: O3

int __thiscall dlib::connection::shutdown(connection *this,int __fd,int __how)

{
  mutex *__mutex;
  int iVar1;
  
  __mutex = &this->sd_mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (this->sd == true) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    iVar1 = this->sdr;
  }
  else {
    this->sd = true;
    iVar1 = ::shutdown(this->connection_socket,2);
    this->sdr = iVar1;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return iVar1;
}

Assistant:

int shutdown (
        ) 
        {
            sd_mutex.lock();
            if (sd)
            {
                sd_mutex.unlock();
                return sdr;
            }
            sd = true;
            sdr = ::shutdown(connection_socket,SHUT_RDWR); 
            int temp = sdr;
            sd_mutex.unlock();            
            return temp;
        }